

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O2

void __thiscall
database::Container::_UpdateValueForIndex
          (Container *this,size_t *index,impl_insert_update_type *new_value)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  difference_type dVar3;
  _Base_ptr p_Var4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
  pair;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
  local_70;
  
  if ((new_value->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var4 = (new_value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(new_value->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
      ::pair(&local_70,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
              *)(p_Var4 + 1));
      p_Var1 = (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
              ::find(&(this->m_schema)._M_t,&local_70.first);
      dVar3 = std::
              __distance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,database::DataType>>>
                        (p_Var1,iVar2._M_node);
      std::__cxx11::string::_M_assign
                ((string *)
                 (*index * 0x20 +
                 *(long *)(*(long *)&(((this->m_data)._M_t.
                                       super___uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_false>
                                      ._M_head_impl)->
                                     super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
                                     )._M_impl + dVar3 * 0x18)));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
      ::~pair(&local_70);
    }
  }
  return;
}

Assistant:

void database::Container::_UpdateValueForIndex(const size_t& index,const database::impl_insert_update_type& new_value)
{
  if(new_value.empty()) return;
  for(auto pair: new_value)
  {
    size_t column_index = std::distance(m_schema.begin(),m_schema.find(pair.first));
    m_data -> operator[](column_index)[index] = pair.second;
  }
}